

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O3

FT_Error cid_size_request(FT_Size size,FT_Size_Request req)

{
  undefined8 *puVar1;
  code *pcVar2;
  FT_Error FVar3;
  FT_Module pFVar4;
  long lVar5;
  PSHinter_Service pshinter;
  
  FVar3 = FT_Request_Metrics(size->face,req);
  if (FVar3 == 0) {
    puVar1 = (undefined8 *)size->face[2].bbox.yMin;
    pFVar4 = FT_Get_Module((size->face->driver->root).library,"pshinter");
    if ((puVar1 != (undefined8 *)0x0 && pFVar4 != (FT_Module)0x0) &&
       (pcVar2 = (code *)*puVar1, pcVar2 != (code *)0x0)) {
      lVar5 = (*pcVar2)(pFVar4);
      if (lVar5 != 0) {
        (**(code **)(lVar5 + 8))
                  (size->internal->module_data,(size->metrics).x_scale,(size->metrics).y_scale,0,0);
      }
    }
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    FT_Error  error;

    PSH_Globals_Funcs  funcs;


    error = FT_Request_Metrics( size->face, req );
    if ( error )
      goto Exit;

    funcs = cid_size_get_globals_funcs( (CID_Size)size );

    if ( funcs )
      funcs->set_scale( (PSH_Globals)size->internal->module_data,
                        size->metrics.x_scale,
                        size->metrics.y_scale,
                        0, 0 );

  Exit:
    return error;
  }